

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall sznet::TimerQueue::expiredProcess(TimerQueue *this,Timestamp now)

{
  TimerCallback *pTVar1;
  EventLoop *this_00;
  size_t sVar2;
  _Manager_type p_Var3;
  bool bVar4;
  int64_t iVar5;
  int64_t iVar6;
  Timer *this_01;
  pair<std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>,_std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>_>
  pVar7;
  undefined1 local_50 [8];
  ActiveTimer activeTimer;
  Timestamp now_local;
  
  this_00 = this->m_loop;
  activeTimer.second = now.m_microSecondsSinceEpoch;
  bVar4 = net::EventLoop::isInLoopThread(this_00);
  if (!bVar4) {
    net::EventLoop::abortNotInLoopThread(this_00);
  }
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (ulong)(this->m_timerMinHeap).m_size) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x62,"void sznet::TimerQueue::expiredProcess(Timestamp)");
  }
  do {
    if ((this->m_timerMinHeap).m_size == 0) {
      this_01 = (Timer *)0x0;
    }
    else {
      this_01 = *(this->m_timerMinHeap).m_ptrArr;
    }
    if (this_01 == (Timer *)0x0) {
LAB_00114fe4:
      if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (ulong)(this->m_timerMinHeap).m_size) {
        return;
      }
      __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x7e,"void sznet::TimerQueue::expiredProcess(Timestamp)");
    }
    local_50 = (undefined1  [8])(this_01->m_expiration).m_microSecondsSinceEpoch;
    iVar5 = Timestamp::microSecondsSinceEpoch((Timestamp *)local_50);
    iVar6 = Timestamp::microSecondsSinceEpoch((Timestamp *)&activeTimer.second);
    if (iVar6 < iVar5) goto LAB_00114fe4;
    activeTimer.first = (Timer *)this_01->m_sequence;
    local_50 = (undefined1  [8])this_01;
    MinHeap<sznet::Timer>::pop(&this->m_timerMinHeap);
    pVar7 = std::
            _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
            ::equal_range(&(this->m_activeTimers)._M_t,(key_type *)local_50);
    sVar2 = (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
    ::_M_erase_aux(&(this->m_activeTimers)._M_t,(_Base_ptr)pVar7.first._M_node,
                   (_Base_ptr)pVar7.second._M_node);
    if (sVar2 - (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1)
    goto LAB_00115001;
    if ((this_01->m_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_00115001:
      __assert_fail("n == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x71,"void sznet::TimerQueue::expiredProcess(Timestamp)");
    }
    pTVar1 = &this_01->m_callback;
    (*(this_01->m_callback)._M_invoker)((_Any_data *)pTVar1);
    if (this_01->m_repeat == true) {
      Timer::restart(this_01,(Timestamp)activeTimer.second);
      addTimerInLoop(this,this_01);
    }
    else {
      p_Var3 = (this_01->m_callback).super__Function_base._M_manager;
      if (p_Var3 != (_Manager_type)0x0) {
        (*p_Var3)((_Any_data *)pTVar1,(_Any_data *)pTVar1,__destroy_functor);
      }
      operator_delete(this_01);
    }
  } while( true );
}

Assistant:

void TimerQueue::expiredProcess(Timestamp now)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.top();
		if (!timer)
		{
			break;
		}
		if (timer->expiration().microSecondsSinceEpoch() > now.microSecondsSinceEpoch())
		{
			break;
		}
		ActiveTimer activeTimer(timer, timer->sequence());
		m_timerMinHeap.pop();
		size_t n = m_activeTimers.erase(activeTimer);
		assert(n == 1); (void)n;
		timer->run();
		if (timer->repeat())
		{
			timer->restart(now);
			addTimerInLoop(timer);
		}
		else 
		{
			delete timer;
			timer = nullptr;
		}
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}